

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::codec_traits<std::vector<double,_std::allocator<double>_>_>::decode
               (Decoder *d,vector<double,_std::allocator<double>_> *s)

{
  Decoder *__x;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  double t;
  size_t i;
  size_t n;
  double *in_stack_ffffffffffffffd8;
  Decoder *d_00;
  
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2c49d8);
  __x = (Decoder *)(**(code **)(*in_RDI + 0x80))();
  while (__x != (Decoder *)0x0) {
    for (d_00 = (Decoder *)0x0; d_00 < __x; d_00 = d_00 + 1) {
      decode<double>(d_00,in_stack_ffffffffffffffd8);
      std::vector<double,_std::allocator<double>_>::push_back(in_RSI,(value_type_conflict4 *)__x);
    }
    __x = (Decoder *)(**(code **)(*in_RDI + 0x88))();
  }
  return;
}

Assistant:

static void decode(Decoder& d, std::vector<T>& s) {
        s.clear();
        for (size_t n = d.arrayStart(); n != 0; n = d.arrayNext()) {
            for (size_t i = 0; i < n; ++i) {
                T t;
                avro::decode(d, t);
                s.push_back(t);
            }
        }
    }